

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tcg_out_qemu_ld(TCGContext_conflict9 *s,TCGArg *args,_Bool is64)

{
  undefined7 in_register_00000011;
  byte bVar1;
  TCGReg addrlo;
  uint mem_index;
  uint opc;
  undefined1 is_64;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  TCGReg oi;
  int in_stack_ffffffffffffff98;
  TCGReg TVar6;
  TCGReg TVar7;
  TCGReg datalo;
  TCGReg TVar8;
  tcg_insn_unit *label_ptr [2];
  
  datalo = (TCGReg)*args;
  addrlo = *(TCGReg *)(args + 1);
  oi = *(TCGReg *)(args + 2);
  mem_index = oi >> 4;
  tcg_out_tlb_load(s,addrlo,oi & TCG_REG_R15,mem_index,(MemOp)label_ptr,(tcg_insn_unit **)0x0,
                   in_stack_ffffffffffffff98);
  uVar5 = mem_index & 8;
  iVar2 = (int)CONCAT71(in_register_00000011,is64);
  uVar3 = iVar2 << 0xc;
  bVar1 = (byte)(uVar5 >> 3) & have_movbe;
  uVar4 = 0;
  if (have_movbe == false) {
    uVar4 = uVar5;
  }
  opc = 0x8b;
  if (bVar1 != 0) {
    opc = 0x2f0;
  }
  TVar8 = datalo;
  switch(mem_index & 7) {
  case 0:
    uVar3 = 0x1b6;
    break;
  case 1:
    tcg_out_modrm_sib_offset(s,0x1b7,datalo,6,-1,0,0);
    is_64 = (undefined1)iVar2;
    TVar6 = oi;
    TVar7 = addrlo;
    if (uVar5 != 0) {
      tcg_out_rolw_8(s,datalo);
    }
    goto LAB_00b27925;
  case 2:
    tcg_out_modrm_sib_offset(s,opc,datalo,6,-1,0,0);
    is_64 = (undefined1)iVar2;
    TVar6 = oi;
    TVar7 = addrlo;
    if (uVar4 != 0) {
      tcg_out_bswap32(s,datalo);
    }
    goto LAB_00b27925;
  case 3:
    tcg_out_modrm_sib_offset(s,opc | 0x1000,datalo,6,-1,0,0);
    is_64 = (undefined1)iVar2;
    TVar6 = oi;
    TVar7 = addrlo;
    if (uVar4 != 0) {
      tcg_out_bswap64(s,datalo);
    }
    goto LAB_00b27925;
  case 4:
    uVar3 = uVar3 | 0x1be;
    break;
  case 5:
    if (uVar5 != 0) {
      TVar6 = oi;
      TVar7 = addrlo;
      if (have_movbe == false) {
        tcg_out_modrm_sib_offset(s,0x1b7,datalo,6,-1,0,0);
        tcg_out_rolw_8(s,datalo);
      }
      else {
        tcg_out_modrm_sib_offset(s,0x6f0,datalo,6,-1,0,0);
      }
      tcg_out_modrm(s,uVar3 | 0x1bf,datalo,datalo);
      is_64 = (undefined1)iVar2;
      goto LAB_00b27925;
    }
    uVar3 = uVar3 | 0x1bf;
    break;
  case 6:
    if (uVar5 != 0) {
      tcg_out_modrm_sib_offset(s,opc,datalo,6,-1,0,0);
      is_64 = (undefined1)iVar2;
      TVar6 = oi;
      if (bVar1 == 0) {
        tcg_out_bswap32(s,datalo);
      }
      tcg_out_ext32s(s,datalo,datalo);
      TVar7 = addrlo;
      goto LAB_00b27925;
    }
    uVar3 = 0x1063;
    break;
  case 7:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ,0x817);
    abort();
  }
  tcg_out_modrm_sib_offset(s,uVar3,datalo,6,-1,0,0);
  is_64 = (undefined1)iVar2;
  TVar6 = oi;
  TVar7 = addrlo;
LAB_00b27925:
  add_qemu_ldst_label(s,true,(_Bool)is_64,oi,datalo,addrlo,(TCGReg)s->code_ptr,(TCGReg)label_ptr,
                      (tcg_insn_unit *)CONCAT44(TVar6,iVar2),(tcg_insn_unit **)CONCAT44(TVar8,TVar7)
                     );
  return;
}

Assistant:

static void tcg_out_qemu_ld(TCGContext *s, const TCGArg *args, bool is64)
{
    TCGReg datalo, datahi, addrlo;
    TCGReg addrhi QEMU_UNUSED_VAR;
    TCGMemOpIdx oi;
    MemOp opc;
    int mem_index;
    tcg_insn_unit *label_ptr[2];

    datalo = *args++;
    datahi = (TCG_TARGET_REG_BITS == 32 && is64 ? *args++ : 0);
    addrlo = *args++;
    addrhi = (TARGET_LONG_BITS > TCG_TARGET_REG_BITS ? *args++ : 0);
    oi = *args++;
    opc = get_memop(oi);

    mem_index = get_mmuidx(oi);

    tcg_out_tlb_load(s, addrlo, addrhi, mem_index, opc,
                     label_ptr, offsetof(CPUTLBEntry, addr_read));

    /* TLB Hit.  */
    tcg_out_qemu_ld_direct(s, datalo, datahi, TCG_REG_L1, -1, 0, 0, is64, opc);

    /* Record the current context of a load into ldst label */
    add_qemu_ldst_label(s, true, is64, oi, datalo, datahi, addrlo, addrhi,
                        s->code_ptr, label_ptr);
}